

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

void tcu::fillWithRepeatableGradient(PixelBufferAccess *access,Vec4 *colorA,Vec4 *colorB)

{
  int iVar1;
  uint uVar2;
  int y;
  int y_00;
  int x;
  int x_00;
  int iVar3;
  int iVar4;
  float fVar5;
  undefined4 in_XMM0_Dd;
  undefined4 uVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 extraout_XMM0_Dd;
  float fVar9;
  float fVar10;
  undefined1 auVar12 [16];
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  undefined1 auVar11 [16];
  
  for (y_00 = 0; y_00 < (access->super_ConstPixelBufferAccess).m_size.m_data[1]; y_00 = y_00 + 1) {
    auVar6._0_4_ = (float)y_00 + 0.5;
    uVar8 = in_XMM0_Dd;
    for (x_00 = 0; iVar1 = (access->super_ConstPixelBufferAccess).m_size.m_data[0], x_00 < iVar1;
        x_00 = x_00 + 1) {
      auVar7._0_4_ = (float)(access->super_ConstPixelBufferAccess).m_size.m_data[1];
      auVar7._4_4_ = (float)iVar1;
      auVar7._8_4_ = (float)(access->super_ConstPixelBufferAccess).m_pitch.m_data[0];
      auVar7._12_4_ = (float)(access->super_ConstPixelBufferAccess).m_pitch.m_data[1];
      auVar6._4_4_ = (float)x_00 + 0.5;
      auVar6._8_4_ = 0;
      auVar6._12_4_ = in_XMM0_Dd;
      auVar7 = divps(auVar6,auVar7);
      fVar5 = auVar7._0_4_;
      fVar10 = auVar7._4_4_;
      fVar9 = fVar10 + fVar10;
      iVar3 = -(uint)(0.5 < fVar5);
      iVar4 = -(uint)(0.5 < fVar10);
      auVar12._4_4_ = iVar4;
      auVar12._0_4_ = iVar3;
      auVar12._8_4_ = iVar4;
      auVar12._12_4_ = iVar4;
      auVar11._8_8_ = auVar12._8_8_;
      auVar11._4_4_ = iVar3;
      auVar11._0_4_ = iVar3;
      uVar2 = movmskpd(iVar1,auVar11);
      if ((uVar2 & 2) != 0) {
        fVar9 = 2.0 - fVar9;
      }
      fVar5 = fVar5 + fVar5;
      if ((uVar2 & 1) != 0) {
        fVar5 = 2.0 - fVar5;
      }
      fVar10 = SQRT(fVar9 * fVar9 + fVar5 * fVar5);
      fVar5 = 1.0;
      if (fVar10 <= 1.0) {
        fVar5 = fVar10;
      }
      operator-(local_50,colorB,colorA);
      operator*(local_40,(float)(-(uint)(0.0 < fVar10) & (uint)fVar5),(Vector<float,_4> *)local_50);
      operator+(local_60,colorA,(Vector<float,_4> *)local_40);
      PixelBufferAccess::setPixel(access,(Vec4 *)local_60,x_00,y_00,0);
      uVar8 = extraout_XMM0_Dd;
    }
    in_XMM0_Dd = uVar8;
  }
  return;
}

Assistant:

void fillWithRepeatableGradient (const PixelBufferAccess& access, const Vec4& colorA, const Vec4& colorB)
{
	for (int y = 0; y < access.getHeight(); y++)
	{
		for (int x = 0; x < access.getWidth(); x++)
		{
			float s = ((float)x + 0.5f) / (float)access.getWidth();
			float t = ((float)y + 0.5f) / (float)access.getHeight();

			float a = s > 0.5f ? (2.0f - 2.0f*s) : 2.0f*s;
			float b = t > 0.5f ? (2.0f - 2.0f*t) : 2.0f*t;

			float p = deFloatClamp(deFloatSqrt(a*a + b*b), 0.0f, 1.0f);
			access.setPixel(linearInterpolate(p, colorA, colorB), x, y);
		}
	}
}